

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMovea<(moira::Instr)72,(moira::Mode)5,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  short in_AX;
  u32 data;
  u32 ea;
  short local_18 [2];
  u32 local_14;
  
  local_18[0] = in_AX;
  bVar1 = readOp<(moira::Mode)5,(moira::Size)2,128ul>(this,opcode & 7,&local_14,(u32 *)local_18);
  if (bVar1) {
    prefetch<4ul>(this);
    *(int *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x38) = (int)local_18[0];
  }
  return;
}

Assistant:

void
Moira::execMovea(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;

    prefetch<POLLIPL>();
    writeA(dst, SEXT<S>(data));
}